

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O2

bool __thiscall slang::ast::Type::isFourState(Type *this)

{
  SymbolKind SVar1;
  SyntaxNode *pSVar2;
  bool bVar3;
  Type *pTVar4;
  Type *pTVar5;
  long lVar6;
  bool bVar7;
  
  while( true ) {
    pTVar4 = getCanonicalType(this);
    bVar3 = isIntegral(pTVar4);
    if (bVar3) {
      return (bool)pTVar4[1].super_Symbol.field_0x5;
    }
    bVar3 = isArray(pTVar4);
    if (!bVar3) break;
    this = getArrayElementType(pTVar4);
  }
  SVar1 = (pTVar4->super_Symbol).kind;
  if (SVar1 != UnpackedUnionType) {
    if (SVar1 != UnpackedStructType) {
      return false;
    }
    pSVar2 = pTVar4[1].super_Symbol.originatingSyntax;
    pTVar4 = pTVar4[1].canonical;
    lVar6 = 0;
    do {
      bVar7 = (long)pTVar4 << 3 == lVar6;
      bVar3 = !bVar7;
      if (bVar7) {
        return bVar3;
      }
      pTVar5 = DeclaredType::getType
                         ((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar6) + 0x40));
      bVar7 = isFourState(pTVar5);
      lVar6 = lVar6 + 8;
    } while (!bVar7);
    return bVar3;
  }
  pSVar2 = pTVar4[1].super_Symbol.originatingSyntax;
  pTVar4 = pTVar4[1].canonical;
  lVar6 = 0;
  do {
    bVar7 = (long)pTVar4 << 3 == lVar6;
    bVar3 = !bVar7;
    if (bVar7) {
      return bVar3;
    }
    pTVar5 = DeclaredType::getType((DeclaredType *)(*(long *)((long)&pSVar2->kind + lVar6) + 0x40));
    bVar7 = isFourState(pTVar5);
    lVar6 = lVar6 + 8;
  } while (!bVar7);
  return bVar3;
}

Assistant:

bool Type::isFourState() const {
    const Type& ct = getCanonicalType();
    if (ct.isIntegral())
        return ct.as<IntegralType>().isFourState;

    if (ct.isArray())
        return ct.getArrayElementType()->isFourState();

    switch (ct.kind) {
        case SymbolKind::UnpackedStructType: {
            auto& us = ct.as<UnpackedStructType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        case SymbolKind::UnpackedUnionType: {
            auto& us = ct.as<UnpackedUnionType>();
            for (auto field : us.fields) {
                if (field->getType().isFourState())
                    return true;
            }
            return false;
        }
        default:
            return false;
    }
}